

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

reference __thiscall
nlohmann::detail::
iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::operator*(iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            *this)

{
  json_value *pjVar1;
  value_t vVar2;
  _Base_ptr p_Var3;
  invalid_iterator *piVar4;
  _Base_ptr p_Var5;
  string local_40;
  
  p_Var5 = (_Base_ptr)this->m_object;
  if (p_Var5 == (_Base_ptr)0x0) {
    __assert_fail("m_object != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/arbiter/third/json/json.hpp"
                  ,0x1ef0,
                  "reference nlohmann::detail::iter_impl<const nlohmann::basic_json<>>::operator*() const [BasicJsonType = const nlohmann::basic_json<>]"
                 );
  }
  vVar2 = (value_t)p_Var5->_M_color;
  if (vVar2 == object) {
    p_Var3 = (this->m_it).object_iterator._M_node;
    if ((_Rb_tree_header *)p_Var3 ==
        &(((json_value *)&p_Var5->_M_parent)->object->_M_t)._M_impl.super__Rb_tree_header) {
      __assert_fail("m_it.object_iterator != m_object->m_value.object->end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/arbiter/third/json/json.hpp"
                    ,0x1ef6,
                    "reference nlohmann::detail::iter_impl<const nlohmann::basic_json<>>::operator*() const [BasicJsonType = const nlohmann::basic_json<>]"
                   );
    }
    p_Var5 = p_Var3 + 2;
  }
  else if (vVar2 == array) {
    pjVar1 = (json_value *)&p_Var5->_M_parent;
    p_Var5 = (_Base_ptr)(this->m_it).array_iterator._M_current;
    if (p_Var5 == (_Base_ptr)
                  (pjVar1->array->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("m_it.array_iterator != m_object->m_value.array->end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/arbiter/third/json/json.hpp"
                    ,0x1efc,
                    "reference nlohmann::detail::iter_impl<const nlohmann::basic_json<>>::operator*() const [BasicJsonType = const nlohmann::basic_json<>]"
                   );
    }
  }
  else {
    if (vVar2 == null) {
      piVar4 = (invalid_iterator *)__cxa_allocate_exception(0x20);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"cannot get value","");
      invalid_iterator::create(piVar4,0xd6,&local_40);
      __cxa_throw(piVar4,&invalid_iterator::typeinfo,exception::~exception);
    }
    if ((this->m_it).primitive_iterator.m_it != 0) {
      piVar4 = (invalid_iterator *)__cxa_allocate_exception(0x20);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"cannot get value","");
      invalid_iterator::create(piVar4,0xd6,&local_40);
      __cxa_throw(piVar4,&invalid_iterator::typeinfo,exception::~exception);
    }
  }
  return (reference)p_Var5;
}

Assistant:

reference operator*() const
    {
        assert(m_object != nullptr);

        switch (m_object->m_type)
        {
            case value_t::object:
            {
                assert(m_it.object_iterator != m_object->m_value.object->end());
                return m_it.object_iterator->second;
            }

            case value_t::array:
            {
                assert(m_it.array_iterator != m_object->m_value.array->end());
                return *m_it.array_iterator;
            }

            case value_t::null:
                JSON_THROW(invalid_iterator::create(214, "cannot get value"));

            default:
            {
                if (JSON_LIKELY(m_it.primitive_iterator.is_begin()))
                {
                    return *m_object;
                }

                JSON_THROW(invalid_iterator::create(214, "cannot get value"));
            }
        }
    }